

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int session_process_priority_frame(nghttp2_session *session)

{
  int iVar1;
  nghttp2_session *in_RDI;
  nghttp2_frame *frame;
  nghttp2_inbound_frame *iframe;
  nghttp2_inbound_frame *payload;
  nghttp2_frame *frame_00;
  
  payload = &in_RDI->iframe;
  frame_00 = &payload->frame;
  iVar1 = session_no_rfc7540_pri_no_fallback(in_RDI);
  if (iVar1 == 0) {
    nghttp2_frame_unpack_priority_payload(&frame_00->priority,(uint8_t *)payload);
    iVar1 = nghttp2_session_on_priority_received(in_RDI,frame_00);
    return iVar1;
  }
  __assert_fail("!session_no_rfc7540_pri_no_fallback(session)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                ,0x118c,"int session_process_priority_frame(nghttp2_session *)");
}

Assistant:

static int session_process_priority_frame(nghttp2_session *session) {
  nghttp2_inbound_frame *iframe = &session->iframe;
  nghttp2_frame *frame = &iframe->frame;

  assert(!session_no_rfc7540_pri_no_fallback(session));

  nghttp2_frame_unpack_priority_payload(&frame->priority, iframe->sbuf.pos);

  return nghttp2_session_on_priority_received(session, frame);
}